

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

stb_vorbis * stb_vorbis_open_filename(char *filename,int *error,stb_vorbis_alloc *alloc)

{
  FILE *alloc_00;
  int *in_RDX;
  undefined4 *in_RSI;
  FILE *in_RDI;
  FILE *f;
  stb_vorbis *local_8;
  
  alloc_00 = fopen((char *)in_RDI,"rb");
  if (alloc_00 == (FILE *)0x0) {
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = 6;
    }
    local_8 = (stb_vorbis *)0x0;
  }
  else {
    local_8 = stb_vorbis_open_file
                        (in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX,(stb_vorbis_alloc *)alloc_00);
  }
  return local_8;
}

Assistant:

stb_vorbis * stb_vorbis_open_filename(const char *filename, int *error, const stb_vorbis_alloc *alloc)
{
   FILE *f;
#if defined(_WIN32) && defined(__STDC_WANT_SECURE_LIB__)
   if (0 != fopen_s(&f, filename, "rb"))
      f = NULL;
#else
   f = fopen(filename, "rb");
#endif
   if (f)
      return stb_vorbis_open_file(f, TRUE, error, alloc);
   if (error) *error = VORBIS_file_open_failure;
   return NULL;
}